

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O0

void __thiscall amrex::StateData::syncNewTimeLevel(StateData *this,Real time)

{
  double dVar1;
  TimeCenter TVar2;
  literals *in_RDI;
  double in_XMM0_Qa;
  Real RVar3;
  double dVar4;
  Real teps;
  
  dVar4 = *(double *)(in_RDI + 0xb0);
  dVar1 = *(double *)(in_RDI + 0xc0);
  RVar3 = literals::operator____rt(in_RDI,_DAT_0194ffa0);
  dVar4 = (dVar4 - dVar1) * RVar3;
  if ((*(double *)(in_RDI + 0xb0) - dVar4 < in_XMM0_Qa) &&
     (in_XMM0_Qa < *(double *)(in_RDI + 0xb0) + dVar4)) {
    TVar2 = StateDescriptor::timeType(*(StateDescriptor **)(in_RDI + 8));
    if (TVar2 == Point) {
      *(double *)(in_RDI + 0xb0) = in_XMM0_Qa;
      *(double *)(in_RDI + 0xa8) = in_XMM0_Qa;
    }
    else {
      *(double *)(in_RDI + 0xb0) = in_XMM0_Qa;
    }
  }
  return;
}

Assistant:

void
StateData::syncNewTimeLevel (Real time)
{
    Real teps = (new_time.stop - old_time.stop)*1.e-3_rt;
    if (time > new_time.stop-teps && time < new_time.stop+teps)
    {
        if (desc->timeType() == StateDescriptor::Point)
        {
            new_time.start = new_time.stop = time;
        }
        else
        {
            new_time.stop = time;
        }
    }
}